

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.h
# Opt level: O0

void __thiscall
spvtools::opt::LoopDescriptor::LoopDescriptor(LoopDescriptor *this,LoopDescriptor *other)

{
  LoopDescriptor *other_local;
  LoopDescriptor *this_local;
  
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector(&this->loops_);
  Loop::Loop(&this->placeholder_top_loop_,(IRContext *)0x0);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  ::unordered_map(&this->basic_block_to_loop_);
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::vector(&this->loops_to_add_);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::operator=
            (&this->loops_,&other->loops_);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::clear(&other->loops_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  ::operator=(&this->basic_block_to_loop_,&other->basic_block_to_loop_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Loop_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>_>
  ::clear(&other->basic_block_to_loop_);
  Loop::operator=(&this->placeholder_top_loop_,&other->placeholder_top_loop_);
  return;
}

Assistant:

LoopDescriptor(LoopDescriptor&& other) : placeholder_top_loop_(nullptr) {
    // We need to take ownership of the Loop objects in the other
    // LoopDescriptor, to avoid double-free.
    loops_ = std::move(other.loops_);
    other.loops_.clear();
    basic_block_to_loop_ = std::move(other.basic_block_to_loop_);
    other.basic_block_to_loop_.clear();
    placeholder_top_loop_ = std::move(other.placeholder_top_loop_);
  }